

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,GLenum e)

{
  int iVar1;
  char *__s;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  switch(iVar1) {
  case 0x8229:
    __s = "r8";
    break;
  case 0x822a:
    __s = "r16";
    break;
  case 0x822b:
    __s = "rg8";
    break;
  case 0x822c:
    __s = "rg16";
    break;
  case 0x822d:
    __s = "r16f";
    break;
  case 0x822e:
    __s = "r32f";
    break;
  case 0x822f:
    __s = "rg16f";
    break;
  case 0x8230:
    __s = "rg32f";
    break;
  case 0x8231:
    __s = "r8i";
    break;
  case 0x8232:
    __s = "r8ui";
    break;
  case 0x8233:
    __s = "r16i";
    break;
  case 0x8234:
    __s = "r16ui";
    break;
  case 0x8235:
    __s = "r32i";
    break;
  case 0x8236:
    __s = "r32ui";
    break;
  case 0x8237:
    __s = "rg8i";
    break;
  case 0x8238:
    __s = "rg8ui";
    break;
  case 0x8239:
    __s = "rg16i";
    break;
  case 0x823a:
    __s = "rg16ui";
    break;
  case 0x823b:
    __s = "rg32i";
    break;
  case 0x823c:
    __s = "rg32ui";
    break;
  default:
    switch(iVar1) {
    case 0x8f94:
      __s = "r8_snorm";
      break;
    case 0x8f95:
      __s = "rg8_snorm";
      break;
    case 0x8f96:
    case 0x8f9a:
switchD_00a2c55e_caseD_8f96:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x244,
                    "std::string gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::FormatEnumToString(GLenum)"
                   );
    case 0x8f97:
      __s = "rgba8_snorm";
      break;
    case 0x8f98:
      __s = "r16_snorm";
      break;
    case 0x8f99:
      __s = "rg16_snorm";
      break;
    case 0x8f9b:
      __s = "rgba16_snorm";
      break;
    default:
      if (iVar1 == 0x8058) {
        __s = "rgba8";
      }
      else if (iVar1 == 0x8059) {
        __s = "rgb10_a2";
      }
      else if (iVar1 == 0x805b) {
        __s = "rgba16";
      }
      else if (iVar1 == 0x906f) {
        __s = "rgb10_a2ui";
      }
      else if (iVar1 == 0x881a) {
        __s = "rgba16f";
      }
      else if (iVar1 == 0x8c3a) {
        __s = "r11f_g11f_b10f";
      }
      else if (iVar1 == 0x8d70) {
        __s = "rgba32ui";
      }
      else if (iVar1 == 0x8d76) {
        __s = "rgba16ui";
      }
      else if (iVar1 == 0x8d7c) {
        __s = "rgba8ui";
      }
      else if (iVar1 == 0x8d82) {
        __s = "rgba32i";
      }
      else if (iVar1 == 0x8d88) {
        __s = "rgba16i";
      }
      else if (iVar1 == 0x8d8e) {
        __s = "rgba8i";
      }
      else {
        if (iVar1 != 0x8814) goto switchD_00a2c55e_caseD_8f96;
        __s = "rgba32f";
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEnumToString(GLenum e)
	{
		switch (e)
		{
		case GL_RGBA32F:
			return "rgba32f";
		case GL_RGBA16F:
			return "rgba16f";
		case GL_RG32F:
			return "rg32f";
		case GL_RG16F:
			return "rg16f";
		case GL_R11F_G11F_B10F:
			return "r11f_g11f_b10f";
		case GL_R32F:
			return "r32f";
		case GL_R16F:
			return "r16f";

		case GL_RGBA32UI:
			return "rgba32ui";
		case GL_RGBA16UI:
			return "rgba16ui";
		case GL_RGB10_A2UI:
			return "rgb10_a2ui";
		case GL_RGBA8UI:
			return "rgba8ui";
		case GL_RG32UI:
			return "rg32ui";
		case GL_RG16UI:
			return "rg16ui";
		case GL_RG8UI:
			return "rg8ui";
		case GL_R32UI:
			return "r32ui";
		case GL_R16UI:
			return "r16ui";
		case GL_R8UI:
			return "r8ui";

		case GL_RGBA32I:
			return "rgba32i";
		case GL_RGBA16I:
			return "rgba16i";
		case GL_RGBA8I:
			return "rgba8i";
		case GL_RG32I:
			return "rg32i";
		case GL_RG16I:
			return "rg16i";
		case GL_RG8I:
			return "rg8i";
		case GL_R32I:
			return "r32i";
		case GL_R16I:
			return "r16i";
		case GL_R8I:
			return "r8i";

		case GL_RGBA16:
			return "rgba16";
		case GL_RGB10_A2:
			return "rgb10_a2";
		case GL_RGBA8:
			return "rgba8";
		case GL_RG16:
			return "rg16";
		case GL_RG8:
			return "rg8";
		case GL_R16:
			return "r16";
		case GL_R8:
			return "r8";

		case GL_RGBA16_SNORM:
			return "rgba16_snorm";
		case GL_RGBA8_SNORM:
			return "rgba8_snorm";
		case GL_RG16_SNORM:
			return "rg16_snorm";
		case GL_RG8_SNORM:
			return "rg8_snorm";
		case GL_R16_SNORM:
			return "r16_snorm";
		case GL_R8_SNORM:
			return "r8_snorm";
		}

		assert(0);
		return "";
	}